

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

void __thiscall
IRBuilderAsmJs::BuildLong1Const1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          int64 constInt64)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  undefined4 *puVar3;
  RegOpnd *this_01;
  Int64ConstOpnd *src1Opnd;
  Instr *instr;
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,newOpcode) != 0xb) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xc1c,"(newOpcode == Js::OpCodeAsmJs::Ld_LongConst)",
                       "newOpcode == Js::OpCodeAsmJs::Ld_LongConst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_01 = BuildDstOpnd(this,dstRegSlot,TyInt64);
  valueType = ValueType::GetInt(false);
  IR::Opnd::SetValueType(&this_01->super_Opnd,valueType);
  src1Opnd = IR::Int64ConstOpnd::New(constInt64,TyInt64,this->m_func);
  instr = IR::Instr::New(Ld_I4,&this_01->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  this_00 = this_01->m_sym;
  if (((this_00->field_0x18 & 1) != 0) && ((this_00->field_5).m_instrDef != (Instr *)0x0)) {
    StackSym::SetIsInt64Const(this_00);
  }
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong1Const1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, int64 constInt64)
{
    Assert(newOpcode == Js::OpCodeAsmJs::Ld_LongConst);

    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
    dstOpnd->SetValueType(ValueType::GetInt(false));

    IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_I4, dstOpnd, IR::Int64ConstOpnd::New(constInt64, TyInt64, m_func), m_func);

    if (dstOpnd->m_sym->IsSingleDef())
    {
        dstOpnd->m_sym->SetIsInt64Const();
    }

    AddInstr(instr, offset);
}